

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

_Bool trans_BKPT(DisasContext_conflict1 *s,arg_BKPT *a)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  TCGContext_conflict1 *s_00;
  TCGContext_conflict1 *tcg_ctx;
  int iVar4;
  uintptr_t o;
  TCGTemp *ts;
  TCGv_i32 pTVar5;
  TCGTemp *local_48;
  TCGTemp *local_40;
  
  uVar3 = s->features;
  if ((short)uVar3 < 0) {
    iVar4 = a->imm;
    s_00 = s->uc->tcg_ctx;
    iVar1 = s->condexec_mask;
    if (iVar1 != 0) {
      iVar2 = s->condexec_cond;
      ts = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
      tcg_gen_op2_aarch64(s_00,INDEX_op_movi_i32,(TCGArg)ts,(long)(iVar1 >> 1 | iVar2 << 4));
      tcg_gen_op3_aarch64(s_00,INDEX_op_st_i32,(TCGArg)ts,(TCGArg)(s_00->cpu_env + (long)s_00),0x224
                         );
      tcg_temp_free_internal_aarch64(s_00,ts);
    }
    tcg_ctx = s->uc->tcg_ctx;
    tcg_gen_op2_aarch64(tcg_ctx,INDEX_op_movi_i32,(TCGArg)(tcg_ctx->cpu_R[0xf] + (long)tcg_ctx),
                        (long)(int)s->pc_curr);
    pTVar5 = tcg_const_i32_aarch64(s_00,(ushort)iVar4 | 0xe2000000);
    local_48 = (TCGTemp *)(s_00->cpu_env + (long)s_00);
    local_40 = (TCGTemp *)(pTVar5 + (long)s_00);
    tcg_gen_callN_aarch64(s_00,helper_exception_bkpt_insn_aarch64,(TCGTemp *)0x0,2,&local_48);
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar5 + (long)s_00));
    (s->base).is_jmp = DISAS_NORETURN;
  }
  return SUB81((uVar3 & 0xffff) >> 0xf,0);
}

Assistant:

static bool trans_BKPT(DisasContext *s, arg_BKPT *a)
{
    if (!ENABLE_ARCH_5) {
        return false;
    }
    if (arm_dc_feature(s, ARM_FEATURE_M) && false && // semihosting_enabled() &&
        !IS_USER(s) &&
        (a->imm == 0xab)) {
        gen_exception_internal_insn(s, s->pc_curr, EXCP_SEMIHOST);
    } else {
        gen_exception_bkpt_insn(s, syn_aa32_bkpt(a->imm, false));
    }
    return true;
}